

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

phnhashelement_t * phninstall(char *name,phnhashelement_t **hashtable)

{
  uint uVar1;
  phnhashelement_t *ppVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  
  ppVar2 = phnlookup(name,hashtable);
  if (ppVar2 == (phnhashelement_t *)0x0) {
    ppVar2 = (phnhashelement_t *)calloc(1,0x18);
    if (ppVar2 != (phnhashelement_t *)0x0) {
      pcVar3 = strdup(name);
      ppVar2->phone = pcVar3;
      if (pcVar3 != (char *)0x0) {
        cVar5 = *name;
        uVar4 = 0;
        if (cVar5 != '\0') {
          pcVar3 = name + 1;
          do {
            uVar1 = (int)uVar4 * 0x1f + (int)cVar5;
            uVar4 = (ulong)uVar1;
            cVar5 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while (cVar5 != '\0');
          uVar4 = (ulong)(uVar1 % 0x65);
        }
        ppVar2->next = hashtable[uVar4];
        hashtable[uVar4] = ppVar2;
        return ppVar2;
      }
    }
    ppVar2 = (phnhashelement_t *)0x0;
  }
  return ppVar2;
}

Assistant:

phnhashelement_t *phninstall(char *name, phnhashelement_t **hashtable)
{
    phnhashelement_t  *np;
    unsigned hashval;

    if ((np = phnlookup(name, hashtable)) == NULL)
    {
        np = (phnhashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->phone = strdup(name)) == NULL)
            return NULL;

        hashval = phnhash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}